

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

void enet_peer_remove_incoming_commands
               (ENetList *queue,ENetListIterator startCommand,ENetListIterator endCommand)

{
  _ENetListNode *p_Var1;
  ENetListIterator in_RDX;
  ENetListIterator in_RSI;
  ENetIncomingCommand *incomingCommand;
  ENetListIterator currentCommand;
  ENetListIterator local_20;
  
  local_20 = in_RSI;
  while (local_20 != in_RDX) {
    p_Var1 = local_20->next;
    enet_list_remove(local_20);
    if ((local_20[5].previous != (_ENetListNode *)0x0) &&
       ((local_20[5].previous)->next =
             (_ENetListNode *)((long)&(local_20[5].previous)->next[-1].previous + 7),
       (local_20[5].previous)->next == (_ENetListNode *)0x0)) {
      enet_packet_destroy((ENetPacket *)0x107dd0);
    }
    if (local_20[5].next != (_ENetListNode *)0x0) {
      enet_free((void *)0x107dea);
    }
    enet_free((void *)0x107df3);
    local_20 = p_Var1;
  }
  return;
}

Assistant:

static void
enet_peer_remove_incoming_commands (ENetList * queue, ENetListIterator startCommand, ENetListIterator endCommand)
{
    ENetListIterator currentCommand;    
    
    for (currentCommand = startCommand; currentCommand != endCommand; )
    {
       ENetIncomingCommand * incomingCommand = (ENetIncomingCommand *) currentCommand;

       currentCommand = enet_list_next (currentCommand);

       enet_list_remove (& incomingCommand -> incomingCommandList);
 
       if (incomingCommand -> packet != NULL)
       {
          -- incomingCommand -> packet -> referenceCount;

          if (incomingCommand -> packet -> referenceCount == 0)
            enet_packet_destroy (incomingCommand -> packet);
       }

       if (incomingCommand -> fragments != NULL)
         enet_free (incomingCommand -> fragments);

       enet_free (incomingCommand);
    }
}